

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::RealMath1Function<&log>::eval
          (RealMath1Function<&log> *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  real_t real;
  double result;
  ConstantValue v;
  ConstantValue *in_stack_ffffffffffffff48;
  EvalContext *in_stack_ffffffffffffff50;
  Expression *in_stack_ffffffffffffff58;
  real_t local_80;
  real_t local_78;
  double local_70;
  undefined4 local_68;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8e2d51);
  if (bVar1) {
    local_78 = slang::ConstantValue::real(in_stack_ffffffffffffff48);
    real.v = real_t::operator_cast_to_double(&local_78);
    local_70 = log(real.v);
    real_t::real_t(&local_80,local_70);
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff48,real);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8e2e12);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        ConstantValue v = args[0]->eval(context);
        if (!v)
            return nullptr;

        double result = Func(v.real());
        return real_t(result);
    }